

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meassure_recv.c
# Opt level: O0

void * receiver(void *_)

{
  size_t sVar1;
  size_t d;
  int i;
  uint32_t nanosecs;
  timespec t0;
  void *__local;
  
  t0.tv_nsec = (__syscall_slong_t)_;
  clock_gettime(1,(timespec *)&i);
  d._0_4_ = 0;
  while( true ) {
    sched_yield();
    sVar1 = (*meassure)((_func_void *)0x1050a0);
    payload[(int)d] = sVar1;
    if ((long)((int)d + 1) == length) break;
    d._4_4_ = (int)interval + (int)t0.tv_sec;
    if (999999999 < d._4_4_) {
      d._4_4_ = d._4_4_ + 0xc4653600;
      _i = _i + 1;
    }
    t0.tv_sec = (__time_t)d._4_4_;
    clock_nanosleep(1,1,(timespec *)&i,(timespec *)0x0);
    d._0_4_ = (int)d + 1;
  }
  return (void *)0x0;
}

Assistant:

void* receiver(void* _)
{
    INIT_CLOCK
    int i = 0;

    while(1)
    {
        sched_yield();
        size_t d = meassure(function + 64);

        payload[i++] = d;

        if(i == length)
            return NULL;

        WAIT_FOR_CLOCK
    }
}